

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redbase.cc
# Opt level: O0

int main(int argc,char **argv)

{
  RC RVar1;
  ostream *poVar2;
  RC rc;
  char *dbname;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  if (argc != 2) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    std::operator<<(poVar2," dbname \n");
    exit(1);
  }
  RVar1 = SM_Manager::OpenDb(&smm,argv[1]);
  if (RVar1 == 0) {
    RBparse(&pfm,&smm,&qlm);
    RVar1 = SM_Manager::CloseDb(&smm);
    if (RVar1 == 0) {
      std::operator<<((ostream *)&std::cout,"Bye.\n");
    }
    else {
      PrintError(RVar1);
      argv_local._4_4_ = 1;
    }
  }
  else {
    PrintError(RVar1);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    char *dbname;
    RC rc;

    // Look for 2 arguments.  The first is always the name of the program
    // that was executed, and the second should be the name of the
    // database.
    if (argc != 2) {
        cerr << "Usage: " << argv[0] << " dbname \n";
        exit(1);
    }

    // Opens up the database folder    
    dbname = argv[1];
    if ((rc = smm.OpenDb(dbname))) {
        PrintError(rc);
        return (1);
    }
    

    RBparse(pfm, smm, qlm);

    // Closes the database folder
    if ((rc = smm.CloseDb())) {
        PrintError(rc);
        return (1);
    }
    

    cout << "Bye.\n";
}